

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

trade_sign helix::nasdaq::itch50_trade_sign(side_type s)

{
  invalid_argument *this;
  trade_sign tVar1;
  undefined7 in_register_00000039;
  allocator local_39;
  string local_38 [32];
  
  tVar1 = (trade_sign)CONCAT71(in_register_00000039,s);
  if (tVar1 != seller_initiated) {
    if (tVar1 != crossing) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string(local_38,"invalid argument",&local_39);
      std::invalid_argument::invalid_argument(this,local_38);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    tVar1 = buyer_initiated;
  }
  return tVar1;
}

Assistant:

trade_sign itch50_trade_sign(side_type s)
{
    switch (s) {
    case side_type::buy:  return trade_sign::seller_initiated;
    case side_type::sell: return trade_sign::buyer_initiated;
    default:              throw std::invalid_argument(std::string("invalid argument"));
    }
}